

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O1

void lyd_np_cont_dflt_set(lyd_node *parent)

{
  uint uVar1;
  lysc_node *plVar2;
  lyd_node *plVar3;
  
  while (((((lyd_node_inner *)parent != (lyd_node_inner *)0x0 &&
           (plVar2 = (((lyd_node_inner *)parent)->field_0).node.schema, plVar2 != (lysc_node *)0x0))
          && (uVar1 = (((lyd_node_inner *)parent)->field_0).node.flags, (uVar1 & 1) == 0)) &&
         ((plVar2->nodetype == 1 && ((plVar2->flags & 0x80) == 0))))) {
    for (plVar3 = ((lyd_node_inner *)parent)->child; plVar3 != (lyd_node *)0x0;
        plVar3 = plVar3->next) {
      if ((plVar3->flags & 1) == 0) {
        return;
      }
    }
    (((lyd_node_inner *)parent)->field_0).node.flags = uVar1 | 1;
    parent = (lyd_node *)(((lyd_node_inner *)parent)->field_0).node.parent;
  }
  return;
}

Assistant:

void
lyd_np_cont_dflt_set(struct lyd_node *parent)
{
    const struct lyd_node *child;

    while (parent) {
        if (!parent->schema || (parent->flags & LYD_DEFAULT) || !lysc_is_np_cont(parent->schema)) {
            /* not a non-dflt NP container */
            break;
        }

        LY_LIST_FOR(lyd_child(parent), child) {
            if (!(child->flags & LYD_DEFAULT)) {
                break;
            }
        }
        if (child) {
            /* explicit child, no dflt change */
            break;
        }

        /* set the dflt flag */
        parent->flags |= LYD_DEFAULT;

        /* check all parent containers */
        parent = lyd_parent(parent);
    }
}